

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O3

int mapHills(Layer *l,int *out,int x,int z,int w,int h)

{
  char cVar1;
  int id1;
  uint64_t uVar2;
  uint64_t uVar3;
  PerlinNoise *noise;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  double dVar19;
  int *local_d0;
  int *local_c0;
  long local_a8;
  int *local_80;
  long local_78;
  
  if (l->p2 == (Layer *)0x0) {
    mapHills_cold_1();
    if (l->p2 != (Layer *)0x0) {
      iVar4 = (*l->p->getMap)(l->p,out,extraout_EDX,z,w,h);
      if (iVar4 == 0) {
        lVar18 = (long)h * (long)w;
        cVar1 = l->mc;
        iVar4 = (*l->p2->getMap)(l->p2,out + lVar18,extraout_EDX,z,w,h);
        if (iVar4 == 0) {
          if (0 < lVar18) {
            lVar9 = 0;
            do {
              uVar17 = out[lVar9];
              uVar8 = uVar17;
              if (((((out + lVar18)[lVar9] == 7) && (uVar17 != 0)) &&
                  ((cVar1 < '\n' || (iVar4 = isOceanic(uVar17), iVar4 == 0)))) &&
                 (uVar8 = 0xb, uVar17 != 0xc)) {
                uVar8 = (uint)((uVar17 & 0xfffffffe) == 0xe) * 8 + 7;
              }
              out[lVar9] = uVar8;
              lVar9 = lVar9 + 1;
            } while (lVar18 - lVar9 != 0);
          }
          iVar4 = 0;
        }
      }
      return iVar4;
    }
    mapRiverMix_cold_1();
    if (0 < h) {
      noise = (PerlinNoise *)l->noise;
      lVar18 = 0;
      do {
        if (0 < w) {
          lVar9 = 0;
          do {
            dVar19 = samplePerlin(noise,(double)(lVar9 + extraout_EDX_00) * 0.125,
                                  (double)(z + lVar18) * 0.125,0.0,0.0,0.0);
            if (dVar19 <= 0.4) {
              if (dVar19 <= 0.2) {
                if (-0.4 <= dVar19) {
                  if (-0.2 <= dVar19) {
                    out[lVar9] = 0;
                  }
                  else {
                    out[lVar9] = 0x2e;
                  }
                }
                else {
                  out[lVar9] = 10;
                }
              }
              else {
                out[lVar9] = 0x2d;
              }
            }
            else {
              out[lVar9] = 0x2c;
            }
            lVar9 = lVar9 + 1;
          } while (w != lVar9);
        }
        lVar18 = lVar18 + 1;
        out = out + w;
      } while (lVar18 != h);
    }
    return 0;
  }
  iVar13 = w + 2;
  iVar16 = h + 2;
  iVar4 = (*l->p->getMap)(l->p,out,x + -1,z + -1,iVar13,iVar16);
  if (iVar4 == 0) {
    lVar18 = (long)iVar13;
    iVar4 = (*l->p2->getMap)(l->p2,out + iVar16 * lVar18,x + -1,z + -1,iVar13,iVar16);
    if (iVar4 == 0) {
      if (0 < h) {
        cVar1 = l->mc;
        iVar13 = (int)cVar1;
        uVar2 = l->startSalt;
        uVar3 = l->startSeed;
        iVar4 = 3;
        if ('\t' < cVar1) {
          iVar4 = 0x22;
        }
        local_a8 = 0;
        iVar15 = 0x18;
        if (cVar1 < '\n') {
          iVar15 = 0;
        }
        local_80 = out + lVar18 * 2 + 1;
        local_78 = (long)out + ((long)iVar16 * 4 + 4) * lVar18 + 4;
        local_c0 = out + lVar18 + 2;
        local_d0 = out;
        do {
          if (0 < w) {
            lVar9 = (long)(z + (int)local_a8);
            lVar14 = 0;
            do {
              iVar16 = local_c0[lVar14 + -1];
              iVar11 = 1;
              if (cVar1 < '\n') {
LAB_0011bcac:
                lVar10 = (long)(x + (int)lVar14);
                lVar12 = uVar3 + lVar10;
                lVar12 = (lVar12 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar12 + lVar9;
                lVar10 = (lVar12 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar12 + lVar10;
                lVar10 = (lVar10 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar10 + lVar9;
                if ((iVar11 == 0) ||
                   ((lVar10 >> 0x18) * -0x5555555555555555 + 0x2aaaaaaaaaaaaaaaU <
                    0x5555555555555555)) {
                  switch(iVar16) {
                  case 0:
                    iVar5 = iVar15;
                    break;
                  case 1:
                    iVar5 = 4;
                    if (('\t' < cVar1) &&
                       (iVar5 = 4,
                       ((long)((lVar10 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar10 + uVar2)
                       >> 0x18) * -0x5555555555555555 + 0x2aaaaaaaaaaaaaaaU < 0x5555555555555555)) {
                      iVar5 = 0x12;
                    }
                    break;
                  case 2:
                    iVar5 = 0x11;
                    break;
                  case 3:
                    iVar5 = iVar4;
                    break;
                  case 4:
                    iVar5 = 0x12;
                    break;
                  case 5:
                    iVar5 = 0x13;
                    break;
                  case 6:
                  case 7:
                  case 8:
                  case 9:
                  case 10:
                  case 0xb:
switchD_0011bd62_caseD_6:
                    iVar7 = areSimilar(iVar13,iVar16,0x26);
                    iVar5 = 0x25;
                    if (iVar7 == 0) {
                      iVar5 = isDeepOcean(iVar16);
                      if ((iVar5 == 0) ||
                         (lVar10 = (lVar10 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar10 +
                                   uVar2,
                         0x5555555555555554 <
                         (lVar10 >> 0x18) * -0x5555555555555555 + 0x2aaaaaaaaaaaaaaaU))
                      goto LAB_0011bf66;
                      iVar5 = (int)lVar10;
                      iVar5 = ((uint)((int)uVar2 + (iVar5 * 0x957f2d + 0x167814f) * iVar5) >> 0x18 &
                              1) * 3 + 1;
                    }
                    break;
                  case 0xc:
                    iVar5 = 0xd;
                    break;
                  default:
                    switch(iVar16) {
                    case 0x15:
                      iVar5 = 0x16;
                      break;
                    case 0x16:
                    case 0x17:
                    case 0x18:
                    case 0x19:
                    case 0x1a:
                    case 0x1c:
                    case 0x1f:
                    case 0x21:
                    case 0x22:
                      goto switchD_0011bd62_caseD_6;
                    case 0x1b:
                      iVar5 = 0x1c;
                      break;
                    case 0x1d:
                      iVar5 = 1;
                      break;
                    case 0x1e:
                      iVar5 = 0x1f;
                      break;
                    case 0x20:
                      iVar5 = 0x21;
                      break;
                    case 0x23:
                      iVar5 = 0x24;
                      break;
                    default:
                      if (iVar16 != 0xa8) goto switchD_0011bd62_caseD_6;
                      iVar5 = 0xa9;
                    }
                  }
                  if (((iVar11 == 0) && (iVar5 != iVar16)) &&
                     (iVar5 = getMutated(iVar13,iVar5), iVar5 < 0)) {
                    iVar5 = iVar16;
                  }
                  if (iVar5 != iVar16) {
                    iVar11 = local_c0[lVar14 + -2];
                    iVar7 = local_c0[lVar14];
                    id1 = local_80[lVar14];
                    iVar6 = areSimilar(iVar13,out[lVar14 + 1],iVar16);
                    iVar7 = areSimilar(iVar13,iVar7,iVar16);
                    uVar17 = (iVar6 != 0) + 1;
                    if (iVar7 == 0) {
                      uVar17 = (uint)(iVar6 != 0);
                    }
                    iVar11 = areSimilar(iVar13,iVar11,iVar16);
                    iVar7 = areSimilar(iVar13,id1,iVar16);
                    if (((uVar17 - (iVar11 == 0)) + 2) - (uint)(iVar7 == 0) < (cVar1 < '\n') + 3) {
                      local_d0[lVar14] = iVar16;
                    }
                    else {
                      local_d0[lVar14] = iVar5;
                    }
                    goto LAB_0011c00e;
                  }
                }
LAB_0011bf66:
                local_d0[lVar14] = iVar16;
              }
              else {
                iVar5 = *(int *)(local_78 + lVar14 * 4);
                iVar11 = (int)((ulong)((long)(iVar5 + -2) * -0x72c234f7) >> 0x20) + iVar5 + -2;
                iVar11 = iVar5 + ((iVar11 >> 4) - (iVar11 >> 0x1f)) * -0x1d + -2;
                if (iVar5 < 2 || iVar11 != 1) goto LAB_0011bcac;
                iVar5 = isShallowOcean(iVar16);
                iVar11 = 1;
                if (iVar5 != 0) goto LAB_0011bcac;
                iVar11 = getMutated(iVar13,iVar16);
                if (iVar11 < 1) goto LAB_0011bf66;
                local_d0[lVar14] = iVar11;
              }
LAB_0011c00e:
              lVar14 = lVar14 + 1;
            } while (w != lVar14);
          }
          local_a8 = local_a8 + 1;
          local_d0 = local_d0 + w;
          local_80 = local_80 + lVar18;
          out = out + lVar18;
          local_78 = local_78 + lVar18 * 4;
          local_c0 = local_c0 + lVar18;
        } while (local_a8 != h);
      }
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int mapHills(const Layer * l, int * out, int x, int z, int w, int h)
{
    int pX = x - 1;
    int pZ = z - 1;
    int64_t pW = w + 2;
    int64_t pH = h + 2;
    int64_t i, j;

    if unlikely(l->p2 == NULL)
    {
        printf("mapHills() requires two parents! Use setupMultiLayer()\n");
        exit(1);
    }